

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O2

void helper_ex(CPUS390XState_conflict *env,uint32_t ilen,uint64_t r1,uint64_t addr)

{
  uint64_t *puVar1;
  uint uVar2;
  byte bVar3;
  uint32_t uVar5;
  uint32_t uVar6;
  ulong uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint uVar10;
  ulong uVar11;
  byte bVar4;
  
  uVar5 = cpu_lduw_code_s390x(env,addr);
  uVar11 = (ulong)((uint)r1 & 0xff | uVar5) << 0x30;
  bVar4 = (byte)(uVar5 >> 8);
  bVar3 = bVar4 >> 6;
  if (bVar3 - 1 < 2) {
    uVar6 = cpu_lduw_code_s390x(env,addr + 2);
    uVar7 = (ulong)uVar6 << 0x20;
  }
  else {
    if (bVar3 == 0) goto LAB_00ae3730;
    uVar6 = cpu_ldl_code_s390x(env,addr + 2);
    uVar7 = (ulong)uVar6 << 0x10;
  }
  uVar11 = uVar11 | uVar7;
LAB_00ae3730:
  if ((uVar5 >> 8 & 0xf0) == 0xd0) {
    uVar10 = uVar5 >> 8 & 0xf;
    if ((0xcf0aU >> uVar10 & 1) == 0) {
      uVar2 = (uint)(uVar11 >> 0x20);
      uVar8 = wrap_address(env,(ulong)(uVar2 & 0xfff) + env->regs[uVar2 >> 0xc & 0xf]);
      uVar9 = wrap_address(env,(ulong)((uint)(uVar11 >> 0x10) & 0xfff) +
                               env->regs[uVar11 >> 0x1c & 0xf]);
      uVar5 = (*helper_ex::dx[uVar10])(env,(uint)(uVar11 >> 0x30) & 0xff,uVar8,uVar9,0);
      env->cc_op = uVar5;
      puVar1 = &(env->psw).addr;
      *puVar1 = *puVar1 + (ulong)ilen;
      return;
    }
  }
  else if (bVar4 == 10) {
    env->int_svc_code = (ushort)(uVar11 >> 0x30) & 0xff;
    env->int_svc_ilen = ilen;
    helper_exception(env,2);
  }
  env->ex_value = uVar11 | ilen;
  return;
}

Assistant:

void HELPER(ex)(CPUS390XState *env, uint32_t ilen, uint64_t r1, uint64_t addr)
{
    uint64_t insn = cpu_lduw_code(env, addr);
    uint8_t opc = insn >> 8;

    /* Or in the contents of R1[56:63].  */
    insn |= r1 & 0xff;

    /* Load the rest of the instruction.  */
    insn <<= 48;
    switch (get_ilen(opc)) {
    case 2:
        break;
    case 4:
        insn |= (uint64_t)cpu_lduw_code(env, addr + 2) << 32;
        break;
    case 6:
        insn |= (uint64_t)(uint32_t)cpu_ldl_code(env, addr + 2) << 16;
        break;
    default:
        g_assert_not_reached();
    }

    /* The very most common cases can be sped up by avoiding a new TB.  */
    if ((opc & 0xf0) == 0xd0) {
        typedef uint32_t (*dx_helper)(CPUS390XState *, uint32_t, uint64_t,
                                      uint64_t, uintptr_t);
        static const dx_helper dx[16] = {
            [0x0] = do_helper_trt_bkwd,
            [0x2] = do_helper_mvc,
            [0x4] = do_helper_nc,
            [0x5] = do_helper_clc,
            [0x6] = do_helper_oc,
            [0x7] = do_helper_xc,
            [0xc] = do_helper_tr,
            [0xd] = do_helper_trt_fwd,
        };
        dx_helper helper = dx[opc & 0xf];

        if (helper) {
            uint32_t l = extract64(insn, 48, 8);
            uint32_t b1 = extract64(insn, 44, 4);
            uint32_t d1 = extract64(insn, 32, 12);
            uint32_t b2 = extract64(insn, 28, 4);
            uint32_t d2 = extract64(insn, 16, 12);
            uint64_t a1 = wrap_address(env, env->regs[b1] + d1);
            uint64_t a2 = wrap_address(env, env->regs[b2] + d2);

            env->cc_op = helper(env, l, a1, a2, 0);
            env->psw.addr += ilen;
            return;
        }
    } else if (opc == 0x0a) {
        env->int_svc_code = extract64(insn, 48, 8);
        env->int_svc_ilen = ilen;
        helper_exception(env, EXCP_SVC);
        g_assert_not_reached();
    }

    /* Record the insn we want to execute as well as the ilen to use
       during the execution of the target insn.  This will also ensure
       that ex_value is non-zero, which flags that we are in a state
       that requires such execution.  */
    env->ex_value = insn | ilen;
}